

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageColorResolveAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  iVar1 = im->colorsTotal;
  if ((long)iVar1 < 1) {
    iVar6 = -1;
    iVar2 = -1;
  }
  else {
    uVar3 = 0xffffffff;
    lVar9 = 0x3f804;
    uVar8 = 0;
    uVar7 = 0xffffffff;
    do {
      if (im->open[uVar8] == 0) {
        if ((uVar8 != (uint)im->transparent) &&
           (lVar4 = (long)im->red[uVar8] - (long)r, lVar10 = (long)im->green[uVar8] - (long)g,
           lVar11 = (long)im->blue[uVar8] - (long)b, lVar5 = (long)im->alpha[uVar8] - (long)a,
           lVar4 = lVar5 * lVar5 + lVar11 * lVar11 + lVar10 * lVar10 + lVar4 * lVar4, lVar4 < lVar9)
           ) {
          if (lVar4 == 0) {
            return (int)uVar8;
          }
          uVar3 = uVar8 & 0xffffffff;
          lVar9 = lVar4;
        }
      }
      else {
        uVar7 = uVar8 & 0xffffffff;
      }
      iVar2 = (int)uVar3;
      iVar6 = (int)uVar7;
      uVar8 = uVar8 + 1;
    } while ((long)iVar1 != uVar8);
  }
  if (iVar6 == -1) {
    if (iVar1 == 0x100) {
      return iVar2;
    }
    im->colorsTotal = iVar1 + 1;
    iVar6 = iVar1;
  }
  im->red[iVar6] = r;
  im->green[iVar6] = g;
  im->blue[iVar6] = b;
  im->alpha[iVar6] = a;
  im->open[iVar6] = 0;
  return iVar6;
}

Assistant:

BGD_DECLARE(int) gdImageColorResolveAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int c;
	int ct = -1;
	int op = -1;
	long rd, gd, bd, ad, dist;
	long mindist = 4 * 255 * 255;	/* init to max poss dist */
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}

	for (c = 0; c < im->colorsTotal; c++) {
		if (im->open[c]) {
			op = c;		/* Save open slot */
			continue;		/* Color not in use */
		}
		if (c == im->transparent) {
			/* don't ever resolve to the color that has
			 * been designated as the transparent color */
			continue;
		}
		rd = (long) (im->red[c] - r);
		gd = (long) (im->green[c] - g);
		bd = (long) (im->blue[c] - b);
		ad = (long) (im->alpha[c] - a);
		dist = rd * rd + gd * gd + bd * bd + ad * ad;
		if (dist < mindist) {
			if (dist == 0) {
				return c;		/* Return exact match color */
			}
			mindist = dist;
			ct = c;
		}
	}
	/* no exact match.  We now know closest, but first try to allocate exact */
	if (op == -1) {
		op = im->colorsTotal;
		if (op == gdMaxColors) {
			/* No room for more colors */
			return ct;		/* Return closest available color */
		}
		im->colorsTotal++;
	}
	im->red[op] = r;
	im->green[op] = g;
	im->blue[op] = b;
	im->alpha[op] = a;
	im->open[op] = 0;
	return op;			/* Return newly allocated color */
}